

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

Expression *
slang::ast::CallExpression::createSystemCall
          (Compilation *compilation,SystemSubroutine *subroutine,Expression *firstArg,
          InvocationExpressionSyntax *syntax,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          SourceRange range,ASTContext *context,Scope *randomizeScope)

{
  SyntaxKind SVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange range_00;
  SourceRange SVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  int iVar7;
  ClassType *pCVar8;
  Symbol *pSVar9;
  byte bVar6;
  Compilation *dst;
  undefined4 extraout_var;
  size_t sVar10;
  ArgumentSyntax *pAVar11;
  SyntaxNode *pSVar12;
  PropertyExprSyntax *pPVar13;
  _Storage<const_slang::ast::SubroutineSymbol_*,_true> _Var14;
  equal_to<const_slang::ast::Symbol_*> *this;
  Symbol **__y;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Scope *pSVar15;
  CallExpression *expr_00;
  pointer in_RCX;
  socklen_t __len;
  uint32_t uVar16;
  Expression *in_RDX;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX;
  SourceLocation in_RSI;
  Compilation *in_RDI;
  pointer in_R8;
  SourceLocation in_R9;
  string_view sVar17;
  SourceRange SVar18;
  undefined1 auVar19 [16];
  LookupLocation LVar20;
  ExpressionKind in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  Scope *in_stack_00000018;
  Expression *arg_2;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *__range2;
  CallExpression *expr;
  Type *type;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *randInfo_1;
  Symbol *sym;
  Expression *arg_1;
  iterator __end5;
  iterator __begin5;
  SmallVector<const_slang::ast::Expression_*,_5UL> *__range5;
  ExpressionSyntax *exSyn;
  OrderedArgumentSyntax *arg;
  size_t index;
  size_t i;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> actualArgs;
  ExpressionSyntax *expr_1;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range6;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> names;
  RandomizeCallInfo randInfo;
  ASTContext argContext;
  RandomizeDetails randomizeDetails;
  ValueSymbol *iterVar;
  Expression *iterOrThis;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  SystemCallInfo callInfo;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *in_stack_fffffffffffff678;
  SourceLocation SVar21;
  Expression *expr_01;
  Compilation *in_stack_fffffffffffff680;
  SmallVector<const_slang::ast::Expression_*,_5UL> *in_stack_fffffffffffff688;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff690;
  Type *in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  SourceLocation in_stack_fffffffffffff6a8;
  DiagCode in_stack_fffffffffffff6b4;
  undefined8 in_stack_fffffffffffff6c0;
  Expression *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  size_t in_stack_fffffffffffff6e8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
  *in_stack_fffffffffffff6f0;
  __extent_storage<18446744073709551615UL> _Var22;
  undefined8 uVar23;
  ASTContext *in_stack_fffffffffffff708;
  ClockingPropertyExprSyntax *in_stack_fffffffffffff710;
  SourceLocation SVar24;
  Type *pTVar25;
  SystemCallInfo *args;
  BumpAllocator *in_stack_fffffffffffff730;
  undefined7 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff747;
  Type *in_stack_fffffffffffff770;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffff778;
  InvocationExpressionSyntax *in_stack_fffffffffffff780;
  pointer pDVar26;
  pointer pDVar27;
  Compilation *in_stack_fffffffffffff788;
  size_t in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  ASTContext *in_stack_fffffffffffff7b0;
  ValueSymbol **in_stack_fffffffffffff7b8;
  Scope *local_668;
  __normal_iterator<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
  local_598;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_590;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *local_580;
  Scope *local_578;
  uint32_t local_570;
  Scope *local_568;
  uint32_t local_560;
  ASTContext *local_558;
  undefined8 local_548;
  CallExpression *local_540;
  undefined1 local_520 [56];
  Symbol *local_4e8;
  Type *local_4e0;
  SourceLocation local_4d8;
  SourceLocation local_4d0;
  Scope *local_4c8;
  SourceRange local_4c0;
  undefined4 local_4ac;
  SourceRange local_4a8;
  anon_union_8_2_f12d5f64_for_typeOrLink local_498;
  SourceRange local_490;
  undefined4 local_47c;
  undefined1 local_478 [24];
  _Storage<const_slang::ast::SubroutineSymbol_*,_true> local_460;
  SourceRange local_458;
  undefined4 local_444;
  Expression *local_440;
  OrderedArgumentSyntax *local_438;
  long local_430;
  ulong local_428;
  SourceRange local_3e8;
  undefined4 local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c0;
  undefined8 local_3b8;
  string_view local_3b0;
  SourceRange local_3a0;
  undefined4 local_38c;
  SyntaxNode *local_388;
  iterator local_380;
  iterator local_370;
  long local_360;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_358;
  SourceRange local_320;
  undefined4 local_30c;
  undefined8 local_300;
  undefined8 local_2f8;
  SourceRange local_2f0;
  undefined4 local_2dc;
  bitmask<slang::ast::ASTFlags> local_2d8;
  sockaddr local_2d0 [2];
  Scope **local_2a8;
  Scope *local_298;
  Symbol *local_290;
  pointer local_288;
  size_t sStack_280;
  undefined1 local_278 [84];
  int local_224;
  SourceRange local_220;
  undefined4 local_20c;
  undefined1 local_208 [32];
  Scope local_1e8;
  SystemSubroutine *local_1a8;
  not_null<const_slang::ast::SystemSubroutine_*> local_1a0;
  value_type_pointer local_198;
  undefined1 local_190 [32];
  SourceLocation local_170;
  pointer local_168;
  pointer local_160;
  Expression *local_158;
  SourceLocation local_150;
  Compilation *local_148;
  CallExpression *local_140;
  NetType *local_138;
  pointer local_130;
  NetType *local_128;
  pointer local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
  local_a0;
  Type *local_88;
  Type *local_80;
  Type *local_78;
  NetType *local_70;
  pointer local_68;
  uint local_5c;
  pointer local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  _Elt_pointer local_38;
  pow2_quadratic_prober local_30;
  Type *local_20;
  Type *local_18;
  Type *local_10;
  pointer local_8;
  ASTContext *context_00;
  
  expr_01 = (Expression *)&stack0x00000008;
  local_170 = in_R9;
  local_168 = in_R8;
  local_160 = in_RCX;
  local_158 = in_RDX;
  local_150 = in_RSI;
  local_148 = in_RDI;
  not_null<const_slang::ast::SystemSubroutine_*>::not_null<const_slang::ast::SystemSubroutine_*>
            (&local_1a0,&local_1a8);
  local_198 = *(value_type_pointer *)local_170;
  memset(local_190,0,0x20);
  std::
  variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
  ::variant((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             *)0x9d25f4);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9d2601);
  if (local_158 != (Expression *)0x0) {
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff680,
               (Expression **)in_stack_fffffffffffff678);
  }
  local_208._8_8_ = (Expression *)0x0;
  local_208._0_8_ = (pointer)0x0;
  if (*(int *)((long)local_150 + 0x34) == 1) {
    if (local_168 == (pointer)0x0) {
      if (((local_160 != (pointer)0x0) && (*(long *)((long)&local_160[2].field_2 + 8) != 0)) &&
         (bVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::empty
                            ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)0x9d26ae), !bVar5
         )) {
        local_20c = 0x680007;
        local_220 = slang::syntax::SyntaxNode::sourceRange
                              ((SyntaxNode *)
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        sourceRange.startLoc._7_1_ = in_stack_fffffffffffff6a7;
        sourceRange.startLoc._0_7_ = in_stack_fffffffffffff6a0;
        sourceRange.endLoc = in_stack_fffffffffffff6a8;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                            sourceRange);
        Diagnostic::operator<<
                  ((Diagnostic *)in_stack_fffffffffffff680,(string *)in_stack_fffffffffffff678);
        local_140 = (CallExpression *)
                    Expression::badExpr(in_stack_fffffffffffff680,
                                        (Expression *)in_stack_fffffffffffff678);
        local_224 = 1;
        goto LAB_009d41d0;
      }
    }
    else if (local_158 != (Expression *)0x0) {
      local_278._64_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff680);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9d2820);
      in_stack_fffffffffffff680 = (Compilation *)local_208;
      sVar17._M_str = in_stack_fffffffffffff798;
      sVar17._M_len = in_stack_fffffffffffff790;
      SVar21 = local_170;
      local_208._8_8_ =
           bindIteratorExpr(in_stack_fffffffffffff788,sVar17,in_stack_fffffffffffff780,
                            in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                            in_stack_fffffffffffff7b0,in_stack_fffffffffffff7b8);
      if (((Expression *)local_208._8_8_ == (Expression *)0x0) ||
         (bVar5 = Expression::bad((Expression *)in_stack_fffffffffffff680), bVar5)) {
        local_140 = (CallExpression *)
                    Expression::badExpr(in_stack_fffffffffffff680,(Expression *)SVar21);
        local_224 = 1;
        goto LAB_009d41d0;
      }
      local_278._48_8_ = local_208._8_8_;
      local_278._56_8_ = local_208._0_8_;
      std::
      variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
      ::operator=((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                   *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                  (IteratorCallInfo *)in_stack_fffffffffffff698);
    }
  }
  else {
    ASTContext::RandomizeDetails::RandomizeDetails((RandomizeDetails *)in_stack_fffffffffffff680);
    local_2d8.m_bits = 0;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_2d8);
    ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffff688,in_stack_fffffffffffff690);
    if (*(int *)((long)local_150 + 0x34) == 2) {
      local_2a8 = &local_298;
      if (local_158 == (Expression *)0x0) {
        if ((in_stack_00000018 != (Scope *)0x0) &&
           (pSVar9 = Scope::asSymbol(in_stack_00000018), pSVar9->kind == ClassType)) {
          local_298 = in_stack_00000018;
        }
      }
      else {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x9d29d9);
        Type::getCanonicalType((Type *)in_stack_fffffffffffff680);
        pCVar8 = Symbol::as<slang::ast::ClassType>((Symbol *)0x9d2a07);
        local_668 = (Scope *)0x0;
        if (pCVar8 != (ClassType *)0x0) {
          local_668 = &pCVar8->super_Scope;
        }
        local_298 = local_668;
        local_290 = Expression::getSymbolReference
                              (in_stack_fffffffffffff6c8,
                               SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x38,0));
      }
      local_208._8_8_ = local_158;
    }
    if (local_168 == (pointer)0x0) {
LAB_009d3072:
      SVar2.endLoc = local_4a8.endLoc;
      SVar2.startLoc = local_4a8.startLoc;
      if ((local_160 != (pointer)0x0) &&
         (local_4a8 = SVar2, *(long *)((long)&local_160[2].field_2 + 8) != 0)) {
        slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::SeparatedSyntaxList
                  ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)in_stack_fffffffffffff680,
                   in_stack_fffffffffffff678);
        local_428 = 0;
        while( true ) {
          uVar4 = local_428;
          sVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::size
                             ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)0x9d30da);
          if (sVar10 <= uVar4) break;
          local_430 = (local_428 + 1) - (ulong)(local_158 == (Expression *)0x0);
          pAVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                              ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                               in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
          SVar1 = (pAVar11->super_SyntaxNode).kind;
          if (SVar1 == EmptyArgument) {
            bVar6 = (**(code **)(*(long *)local_150 + 0x10))(local_150,local_430);
            if ((bVar6 & 1) == 0) {
              local_4ac = 0x4d0007;
              slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                        ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                         in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
              local_4c0 = slang::syntax::SyntaxNode::sourceRange
                                    ((SyntaxNode *)
                                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              sourceRange_05.startLoc._7_1_ = in_stack_fffffffffffff6a7;
              sourceRange_05.startLoc._0_7_ = in_stack_fffffffffffff6a0;
              sourceRange_05.endLoc = in_stack_fffffffffffff6a8;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                                  sourceRange_05);
              local_140 = (CallExpression *)
                          Expression::badExpr(in_stack_fffffffffffff680,
                                              (Expression *)in_stack_fffffffffffff678);
              local_224 = 1;
              goto LAB_009d3d83;
            }
            Compilation::getVoidType(local_148);
            slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                      ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                       in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
            SVar18 = slang::syntax::SyntaxNode::sourceRange
                               ((SyntaxNode *)
                                CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            local_4a8 = SVar18;
            local_498.typeSyntax =
                 (DataTypeSyntax *)
                 BumpAllocator::
                 emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                           ((BumpAllocator *)
                            CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                            in_stack_fffffffffffff698,
                            (SourceRange *)in_stack_fffffffffffff690.m_bits);
            SmallVectorBase<const_slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff680,
                       (Expression **)in_stack_fffffffffffff678);
          }
          else {
            if (SVar1 == NamedArgument) {
              local_47c = 0x790007;
              slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                        ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                         in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
              local_490 = slang::syntax::SyntaxNode::sourceRange
                                    ((SyntaxNode *)
                                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              sourceRange_04.startLoc._7_1_ = in_stack_fffffffffffff6a7;
              sourceRange_04.startLoc._0_7_ = in_stack_fffffffffffff6a0;
              sourceRange_04.endLoc = in_stack_fffffffffffff6a8;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                                  sourceRange_04);
              local_140 = (CallExpression *)
                          Expression::badExpr(in_stack_fffffffffffff680,
                                              (Expression *)in_stack_fffffffffffff678);
              local_224 = 1;
              goto LAB_009d3d83;
            }
            pSVar12 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                                 ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                                  in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678)->
                       super_SyntaxNode;
            local_438 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedArgumentSyntax>(pSVar12)
            ;
            pPVar13 = not_null<slang::syntax::PropertyExprSyntax_*>::operator->
                                ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9d31b6);
            if ((pPVar13->super_SyntaxNode).kind == ClockingPropertyExpr) {
              bVar6 = (**(code **)(*(long *)local_150 + 0x18))(local_150,local_430);
              if ((bVar6 & 1) == 0) {
                local_444 = 0x9e0007;
                slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                          ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)
                           in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
                local_458 = slang::syntax::SyntaxNode::sourceRange
                                      ((SyntaxNode *)
                                       CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)
                                      );
                sourceRange_03.startLoc._7_1_ = in_stack_fffffffffffff6a7;
                sourceRange_03.startLoc._0_7_ = in_stack_fffffffffffff6a0;
                sourceRange_03.endLoc = in_stack_fffffffffffff6a8;
                ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,
                                    in_stack_fffffffffffff6b4,sourceRange_03);
                local_140 = (CallExpression *)
                            Expression::badExpr(in_stack_fffffffffffff680,
                                                (Expression *)in_stack_fffffffffffff678);
                local_224 = 1;
                goto LAB_009d3d83;
              }
              pSVar12 = &not_null<slang::syntax::PropertyExprSyntax_*>::operator->
                                   ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9d3211)->
                         super_SyntaxNode;
              slang::syntax::SyntaxNode::as<slang::syntax::ClockingPropertyExprSyntax>(pSVar12);
              local_440 = ClockingEventExpression::fromSyntax
                                    (in_stack_fffffffffffff710,in_stack_fffffffffffff708);
              SmallVectorBase<const_slang::ast::Expression_*>::push_back
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)
                         in_stack_fffffffffffff680,(Expression **)in_stack_fffffffffffff678);
            }
            else {
              not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                        ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9d336d);
              _Var14._M_value =
                   (SubroutineSymbol *)
                   ASTContext::requireSimpleExpr
                             ((ASTContext *)in_stack_fffffffffffff680,
                              (PropertyExprSyntax *)in_stack_fffffffffffff678);
              SVar21 = local_150;
              lVar3 = local_430;
              local_460._M_value = _Var14._M_value;
              if (_Var14._M_value == (SubroutineSymbol *)0x0) {
                local_140 = (CallExpression *)
                            Expression::badExpr(in_stack_fffffffffffff680,
                                                (Expression *)in_stack_fffffffffffff678);
                local_224 = 1;
                goto LAB_009d3d83;
              }
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              span<slang::SmallVector<const_slang::ast::Expression_*,_5UL>_&>
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         in_stack_fffffffffffff690.m_bits,in_stack_fffffffffffff688);
              local_478._16_8_ =
                   (**(code **)(*(long *)SVar21 + 0x28))
                             (SVar21,lVar3,local_2d0,_Var14._M_value,local_478);
              SmallVectorBase<const_slang::ast::Expression_*>::push_back
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)
                         in_stack_fffffffffffff680,(Expression **)in_stack_fffffffffffff678);
            }
          }
          local_428 = local_428 + 1;
        }
      }
      if (local_168 != (pointer)0x0) {
        if (local_298 == (Scope *)0x0) {
          local_4c8 = (Scope *)(local_208 + 0x20);
          local_4d0 = (SourceLocation)
                      SmallVectorBase<const_slang::ast::Expression_*>::begin
                                ((SmallVectorBase<const_slang::ast::Expression_*> *)local_4c8);
          local_4d8 = (SourceLocation)
                      SmallVectorBase<const_slang::ast::Expression_*>::end
                                ((SmallVectorBase<const_slang::ast::Expression_*> *)local_4c8);
          for (; local_4d0 != local_4d8; local_4d0 = (SourceLocation)((long)local_4d0 + 8)) {
            local_4e0 = *(Type **)local_4d0;
            local_4e8 = Expression::getSymbolReference
                                  (in_stack_fffffffffffff6c8,
                                   SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x38,0));
            if (local_4e8 != (Symbol *)0x0) {
              pDVar26 = (pointer)local_278;
              local_138 = (NetType *)&local_4e8;
              local_130 = pDVar26;
              local_128 = local_138;
              local_120 = pDVar26;
              local_70 = local_138;
              local_68 = pDVar26;
              local_78 = (Type *)boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                                 ::key_from<slang::ast::Symbol_const*>((Symbol **)0x9d389c);
              local_80 = (Type *)boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                                 ::hash_for<slang::ast::Symbol_const*>
                                           ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                                             *)in_stack_fffffffffffff680,
                                            (Symbol **)in_stack_fffffffffffff678);
              local_88 = (Type *)boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                                 ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                                                 *)in_stack_fffffffffffff680,
                                                (size_t)in_stack_fffffffffffff678);
              local_10 = local_78;
              local_20 = local_80;
              pDVar27 = pDVar26;
              local_18 = local_88;
              local_8 = pDVar26;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_30,(size_t)local_88);
              do {
                local_38 = (_Elt_pointer)
                           boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
                local_40 = boost::unordered::detail::foa::
                           table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
                           ::groups((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
                                     *)0x9d399b);
                local_40 = local_40 + (long)local_38;
                local_44 = boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::match
                                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                                      in_stack_fffffffffffff688,(size_t)in_stack_fffffffffffff680);
                if (local_44 != 0) {
                  local_50 = boost::unordered::detail::foa::
                             table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
                             ::elements((table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
                                         *)0x9d39f9);
                  local_58 = (pointer)(local_50 + (long)local_38 * 0xf);
                  do {
                    local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    this = boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                           ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                                   *)0x9d3a4c);
                    pTVar25 = local_10;
                    __y = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                          ::key_from<slang::ast::Symbol_const*>((Symbol **)0x9d3a7c);
                    bVar5 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                                      (this,(Symbol **)pTVar25,__y);
                    if (bVar5) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
                      ::table_locator(&local_a0,local_40,local_5c,
                                      (Symbol **)
                                      (&(local_58->members).
                                        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_5c));
                      goto LAB_009d3b98;
                    }
                    local_44 = local_44 - 1 & local_44;
                  } while (local_44 != 0);
                }
                in_stack_fffffffffffff747 =
                     boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
                if ((bool)in_stack_fffffffffffff747) {
                  memset(&local_a0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
                  ::table_locator(&local_a0);
                  goto LAB_009d3b98;
                }
                bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_30,
                                   (size_t)(pDVar26->members).
                                           super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
              } while (bVar5);
              memset(&local_a0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Symbol_*>
              ::table_locator(&local_a0);
LAB_009d3b98:
              bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_a0);
              if (bVar5) {
                local_b0 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                           ::make_iterator((locator *)0x9d3bba);
                local_b1 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)(local_520 + 0x20),&local_b0,&local_b1);
              }
              else if ((pDVar27->forwardingTypedefs).
                       super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage <
                       (pDVar27->forwardingTypedefs).
                       super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::unchecked_emplace_at<slang::ast::Symbol_const*&>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                            *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                           (size_t)in_stack_fffffffffffff698,in_stack_fffffffffffff690.m_bits,
                           (Symbol **)in_stack_fffffffffffff688);
                local_c8 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                           ::make_iterator((locator *)0x9d3c42);
                local_e1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)(local_520 + 0x20),&local_c8,local_e1);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                          (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                           (Symbol **)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0))
                ;
                local_f8 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                           ::make_iterator((locator *)0x9d3cad);
                local_111[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                            *)(local_520 + 0x20),&local_f8,local_111);
              }
            }
          }
        }
        local_520._24_8_ =
             std::
             get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                       ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                         *)0x9d3d14);
        local_288 = ((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                      *)(local_520._24_8_ + 8))->_M_ptr;
        sStack_280 = ((__extent_storage<18446744073709551615UL> *)(local_520._24_8_ + 0x10))->
                     _M_extent_value;
        iVar7 = Constraint::bind((int)*(undefined8 *)((long)&local_168[1].field_2 + 8),local_2d0,
                                 __len);
        in_stack_fffffffffffff730 = (BumpAllocator *)CONCAT44(extraout_var_00,iVar7);
        *(BumpAllocator **)local_520._24_8_ = in_stack_fffffffffffff730;
      }
      local_224 = 0;
    }
    else if (*(int *)((long)local_150 + 0x34) == 2) {
      if (*(long *)((long)&local_168[1].field_2 + 8) != 0) {
        RandomizeCallInfo::RandomizeCallInfo((RandomizeCallInfo *)0x9d2bd1);
        if (local_168[1].field_2._M_allocated_capacity != 0) {
          if ((local_2a8 == (Scope **)0x0) || (*local_2a8 == (Scope *)0x0)) {
            local_30c = 0x780007;
            local_320 = slang::syntax::SyntaxNode::sourceRange
                                  ((SyntaxNode *)
                                   CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            sourceRange_01.startLoc._7_1_ = in_stack_fffffffffffff6a7;
            sourceRange_01.startLoc._0_7_ = in_stack_fffffffffffff6a0;
            sourceRange_01.endLoc = in_stack_fffffffffffff6a8;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                                sourceRange_01);
            local_140 = (CallExpression *)
                        Expression::badExpr(in_stack_fffffffffffff680,
                                            (Expression *)in_stack_fffffffffffff678);
            local_224 = 1;
            goto LAB_009d3d83;
          }
          SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
                    ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                     0x9d2cbd);
          local_360 = local_168[1].field_2._M_allocated_capacity + 0x28;
          local_370 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                                ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x9d2ce2);
          local_380 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                                ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                 in_stack_fffffffffffff680);
          while( true ) {
            bVar5 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                              ((self_type *)in_stack_fffffffffffff680,
                               (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                               in_stack_fffffffffffff678);
            if (((bVar5 ^ 0xffU) & 1) == 0) break;
            local_388 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                                      *)0x9d2d90)->super_SyntaxNode;
            if (local_388->kind == IdentifierName) {
              slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(local_388);
              sVar17 = parsing::Token::valueText((Token *)in_stack_fffffffffffff690.m_bits);
              local_3b0 = sVar17;
              SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
                        ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         in_stack_fffffffffffff680,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff678);
            }
            else {
              local_38c = 0x410005;
              SVar18 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)
                                  CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
              sourceRange_02.startLoc._7_1_ = in_stack_fffffffffffff6a7;
              sourceRange_02.startLoc._0_7_ = in_stack_fffffffffffff6a0;
              sourceRange_02.endLoc = in_stack_fffffffffffff6a8;
              local_3a0 = SVar18;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                                  sourceRange_02);
            }
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
            ::
            operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                        *)in_stack_fffffffffffff680);
          }
          dst = ASTContext::getCompilation((ASTContext *)0x9d2eed);
          iVar7 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::copy
                            (&local_358,(EVP_PKEY_CTX *)dst,src);
          local_3d0 = CONCAT44(extraout_var,iVar7);
          std::
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          ::span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                    ((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                      *)in_stack_fffffffffffff690.m_bits,
                     (span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                      *)in_stack_fffffffffffff688);
          local_300 = local_3c0;
          local_2f8 = local_3b8;
          SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
                    ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                     0x9d2f80);
        }
        std::
        variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
        ::operator=((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                    (RandomizeCallInfo *)in_stack_fffffffffffff698);
        goto LAB_009d3072;
      }
      local_2dc = 0x6d0007;
      local_2f0 = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)
                             CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffff6a7;
      sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffff6a0;
      sourceRange_00.endLoc = in_stack_fffffffffffff6a8;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                          sourceRange_00);
      local_140 = (CallExpression *)
                  Expression::badExpr(in_stack_fffffffffffff680,
                                      (Expression *)in_stack_fffffffffffff678);
      local_224 = 1;
    }
    else {
      local_3d4 = 0xad0007;
      local_3e8 = parsing::Token::range
                            ((Token *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0))
      ;
      SVar18.startLoc._7_1_ = in_stack_fffffffffffff6a7;
      SVar18.startLoc._0_7_ = in_stack_fffffffffffff6a0;
      SVar18.endLoc = in_stack_fffffffffffff6a8;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,SVar18);
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_fffffffffffff680,(string *)in_stack_fffffffffffff678);
      local_140 = (CallExpression *)
                  Expression::badExpr(in_stack_fffffffffffff680,
                                      (Expression *)in_stack_fffffffffffff678);
      local_224 = 1;
    }
LAB_009d3d83:
    ASTContext::RandomizeDetails::~RandomizeDetails((RandomizeDetails *)0x9d3d90);
    if (local_224 != 0) goto LAB_009d41d0;
  }
  pTVar25 = (Type *)local_520;
  SVar21 = local_170;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::ast::Expression_*,_5UL>_&>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffff690.m_bits,in_stack_fffffffffffff688);
  auVar19 = (**(code **)(*(long *)local_150 + 0x38))
                      (local_150,SVar21,pTVar25,CONCAT44(in_stack_0000000c,in_stack_00000008),
                       CONCAT44(in_stack_00000014,in_stack_00000010),local_208._8_8_);
  args = auVar19._0_8_;
  local_548 = 0;
  local_520._16_8_ = args;
  iVar7 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)(local_208 + 0x20),
                     (EVP_PKEY_CTX *)local_148,auVar19._8_8_);
  context_00 = (ASTContext *)CONCAT44(extraout_var_01,iVar7);
  uVar23 = extraout_RDX;
  local_558 = context_00;
  LVar20 = ASTContext::getLocation((ASTContext *)in_stack_fffffffffffff680);
  pSVar15 = LVar20.scope;
  uVar16 = LVar20.index;
  local_578 = pSVar15;
  local_570 = uVar16;
  local_568 = pSVar15;
  local_560 = uVar16;
  expr_00 = BumpAllocator::
            emplace<slang::ast::CallExpression,slang::ast::CallExpression::SystemCallInfo&,slang::ast::Type_const&,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                      (in_stack_fffffffffffff730,args,pTVar25,(void **)SVar21,
                       (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)local_150,
                       (LookupLocation *)context_00,
                       (SourceRange *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740))
  ;
  local_540 = expr_00;
  bVar5 = Type::isError((Type *)0x9d3f77);
  if (bVar5) {
    local_140 = (CallExpression *)Expression::badExpr(in_stack_fffffffffffff680,expr_01);
    local_224 = 1;
  }
  else {
    local_590 = arguments(local_540);
    local_580 = &local_590;
    local_598._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*,_18446744073709551615UL> *)expr_01);
    std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
               in_stack_fffffffffffff688);
    _Var22._M_extent_value = (size_t)local_148;
    SVar24 = local_150;
    while( true ) {
      bVar5 = __gnu_cxx::
              operator==<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffff680,
                         (__normal_iterator<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
                          *)expr_01);
      if (((bVar5 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
      ::operator*(&local_598);
      bVar5 = Expression::bad((Expression *)in_stack_fffffffffffff680);
      if (bVar5) {
        local_140 = (CallExpression *)Expression::badExpr(in_stack_fffffffffffff680,expr_01);
        local_224 = 1;
        goto LAB_009d41d0;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_**,_std::span<const_slang::ast::Expression_*,_18446744073709551615UL>_>
      ::operator++(&local_598);
    }
    range_00.endLoc = SVar21;
    range_00.startLoc = SVar24;
    bVar5 = checkOutputArgs(context_00,SUB81((ulong)uVar23 >> 0x38,0),range_00);
    if (bVar5) {
      if (local_160 != (pointer)0x0) {
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)local_540,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_170);
        syntax_00._M_extent._M_extent_value = _Var22._M_extent_value;
        syntax_00._M_ptr = (pointer)pSVar15;
        ASTContext::setAttributes
                  ((ASTContext *)CONCAT44(uVar16,in_stack_fffffffffffff6e0),
                   &expr_00->super_Expression,syntax_00);
      }
      local_140 = local_540;
      local_224 = 1;
    }
    else {
      local_140 = (CallExpression *)Expression::badExpr(in_stack_fffffffffffff680,expr_01);
      local_224 = 1;
    }
  }
LAB_009d41d0:
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9d41dd);
  return &local_140->super_Expression;
}

Assistant:

Expression& CallExpression::createSystemCall(
    Compilation& compilation, const SystemSubroutine& subroutine, const Expression* firstArg,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, SourceRange range,
    const ASTContext& context, const Scope* randomizeScope) {

    SystemCallInfo callInfo{&subroutine, context.scope, {}};
    SmallVector<const Expression*> buffer;
    if (firstArg)
        buffer.push_back(firstArg);

    const Expression* iterOrThis = nullptr;
    const ValueSymbol* iterVar = nullptr;
    using WithClauseMode = SystemSubroutine::WithClauseMode;
    if (subroutine.withClauseMode == WithClauseMode::Iterator) {
        // 'with' clause is not required. If it's not there, no arguments
        // can be provided.
        if (!withClause) {
            if (syntax && syntax->arguments && !syntax->arguments->parameters.empty()) {
                context.addDiag(diag::IteratorArgsWithoutWithClause,
                                syntax->arguments->sourceRange())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }
        else if (firstArg) {
            iterOrThis = bindIteratorExpr(compilation, subroutine.name, syntax, *withClause,
                                          *firstArg->type, context, iterVar);
            if (!iterOrThis || iterOrThis->bad())
                return badExpr(compilation, iterOrThis);

            callInfo.extraInfo = IteratorCallInfo{iterOrThis, iterVar};
        }
    }
    else {
        ASTContext::RandomizeDetails randomizeDetails;
        ASTContext argContext = context.resetFlags({});

        if (subroutine.withClauseMode == WithClauseMode::Randomize) {
            // If this is a class-scoped randomize call, setup the scope properly
            // so that class members can be found in the constraint block.
            argContext.randomizeDetails = &randomizeDetails;
            if (firstArg) {
                randomizeDetails.classType = &firstArg->type->getCanonicalType().as<ClassType>();
                randomizeDetails.thisVar = firstArg->getSymbolReference();
            }
            else if (randomizeScope && randomizeScope->asSymbol().kind == SymbolKind::ClassType) {
                randomizeDetails.classType = randomizeScope;
            }
            iterOrThis = firstArg;
        }

        if (withClause) {
            if (subroutine.withClauseMode == WithClauseMode::Randomize) {
                if (!withClause->constraints) {
                    argContext.addDiag(diag::MissingConstraintBlock, withClause->sourceRange());
                    return badExpr(compilation, nullptr);
                }

                RandomizeCallInfo randInfo;
                if (withClause->args) {
                    if (!argContext.randomizeDetails || !argContext.randomizeDetails->classType) {
                        argContext.addDiag(diag::NameListWithScopeRandomize,
                                           withClause->args->sourceRange());
                        return badExpr(compilation, nullptr);
                    }

                    SmallVector<std::string_view> names;
                    for (auto expr : withClause->args->expressions) {
                        if (expr->kind != SyntaxKind::IdentifierName) {
                            argContext.addDiag(diag::ExpectedIdentifier, expr->sourceRange());
                            continue;
                        }

                        names.push_back(expr->as<IdentifierNameSyntax>().identifier.valueText());
                    }

                    randInfo.constraintRestrictions = names.copy(argContext.getCompilation());
                }

                callInfo.extraInfo = randInfo;
            }
            else {
                argContext.addDiag(diag::WithClauseNotAllowed, withClause->with.range())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }

        // Bind arguments as we would for any ordinary method.
        if (syntax && syntax->arguments) {
            auto actualArgs = syntax->arguments->parameters;
            for (size_t i = 0; i < actualArgs.size(); i++) {
                size_t index = i + (firstArg ? 1 : 0);
                switch (actualArgs[i]->kind) {
                    case SyntaxKind::OrderedArgument: {
                        const auto& arg = actualArgs[i]->as<OrderedArgumentSyntax>();
                        if (arg.expr->kind == SyntaxKind::ClockingPropertyExpr) {
                            if (subroutine.allowClockingArgument(index)) {
                                buffer.push_back(&ClockingEventExpression::fromSyntax(
                                    arg.expr->as<ClockingPropertyExprSyntax>(), argContext));
                            }
                            else {
                                argContext.addDiag(diag::TimingControlNotAllowed,
                                                   actualArgs[i]->sourceRange());
                                return badExpr(compilation, nullptr);
                            }
                        }
                        else if (auto exSyn = context.requireSimpleExpr(*arg.expr)) {
                            buffer.push_back(
                                &subroutine.bindArgument(index, argContext, *exSyn, buffer));
                        }
                        else {
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    }
                    case SyntaxKind::NamedArgument:
                        argContext.addDiag(diag::NamedArgNotAllowed, actualArgs[i]->sourceRange());
                        return badExpr(compilation, nullptr);
                    case SyntaxKind::EmptyArgument:
                        if (subroutine.allowEmptyArgument(index)) {
                            buffer.push_back(compilation.emplace<EmptyArgumentExpression>(
                                compilation.getVoidType(), actualArgs[i]->sourceRange()));
                        }
                        else {
                            argContext.addDiag(diag::EmptyArgNotAllowed,
                                               actualArgs[i]->sourceRange());
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        if (withClause) {
            // Finally bind the inline constraint block if we have one.
            SLANG_ASSERT(withClause->constraints);

            // For scope randomize calls we need to register the
            // arg variables so they get treated as 'rand'.
            if (!randomizeDetails.classType) {
                for (auto arg : buffer) {
                    auto sym = arg->getSymbolReference();
                    if (sym)
                        randomizeDetails.scopeRandVars.emplace(sym);
                }
            }

            auto& randInfo = std::get<2>(callInfo.extraInfo);
            randomizeDetails.nameRestrictions = randInfo.constraintRestrictions;
            randInfo.inlineConstraints = &Constraint::bind(*withClause->constraints, argContext);
        }
    }

    const Type& type = subroutine.checkArguments(context, buffer, range, iterOrThis);
    auto expr = compilation.emplace<CallExpression>(callInfo, type, nullptr,
                                                    buffer.copy(compilation), context.getLocation(),
                                                    range);

    if (type.isError())
        return badExpr(compilation, expr);

    for (auto arg : expr->arguments()) {
        if (arg->bad())
            return badExpr(compilation, expr);
    }

    if (!checkOutputArgs(context, subroutine.hasOutputArgs, range))
        return badExpr(compilation, expr);

    if (syntax)
        context.setAttributes(*expr, syntax->attributes);

    return *expr;
}